

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O0

Int __thiscall
ipx::Maxvolume::ScaleFtran
          (Maxvolume *this,double colscale_jn,Vector *invscale_basic,IndexedVector *ftran)

{
  anon_class_32_4_08870b64 *in_RSI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  anon_class_32_4_08870b64 fcn;
  Int pmax;
  double vmax;
  
  for_each_nonzero<ipx::Maxvolume::ScaleFtran(double,std::valarray<double>const&,ipx::IndexedVector&)::__0>
            ((IndexedVector *)CONCAT44(in_XMM0_Db,in_XMM0_Da),in_RSI);
  return 0;
}

Assistant:

Int Maxvolume::ScaleFtran(double colscale_jn, const Vector& invscale_basic,
                          IndexedVector& ftran) {
    double vmax = 0.0;
    Int pmax = 0;
    auto fcn = [&](Int p, double& pivot) {
        double scaled_pivot = pivot * colscale_jn * invscale_basic[p];
        double v = std::abs(scaled_pivot);
        if (v > vmax && std::abs(pivot) > kPivotZeroTol) {
            vmax = v;
            pmax = p;
        }
        pivot = scaled_pivot;
    };
    for_each_nonzero(ftran, fcn);
    return pmax;
}